

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeMatrixDebugType(Builder *this,Id vectorType,int vectorCount,bool columnMajor)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  Builder *this_01;
  Id IVar1;
  Id IVar2;
  mapped_type *pmVar3;
  Instruction *pIVar4;
  mapped_type_conflict *pmVar5;
  undefined7 in_register_00000009;
  int t;
  long lVar6;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  Builder *local_48;
  Instruction *type;
  undefined4 local_38;
  Id vectorType_local;
  
  local_38 = (undefined4)CONCAT71(in_register_00000009,columnMajor);
  this_00 = &this->groupedDebugTypes;
  lVar6 = 0;
  local_48 = this;
  vectorType_local = vectorType;
  while( true ) {
    local_50._M_head_impl._0_4_ = 0x6c;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_50);
    if ((int)((ulong)((long)(pmVar3->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar3->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar6) break;
    local_50._M_head_impl._0_4_ = 0x6c;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_50);
    pIVar4 = (pmVar3->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar6];
    type = pIVar4;
    IVar1 = Instruction::getIdOperand(pIVar4,0);
    if (IVar1 == vectorType) {
      IVar1 = Instruction::getIdOperand(pIVar4,1);
      IVar2 = makeUintConstant(local_48,vectorCount,false);
      if (IVar1 == IVar2) goto LAB_00359729;
    }
    lVar6 = lVar6 + 1;
  }
  pIVar4 = (Instruction *)::operator_new(0x60);
  this_01 = local_48;
  IVar2 = local_48->uniqueId + 1;
  local_48->uniqueId = IVar2;
  IVar1 = makeVoidType(local_48);
  pIVar4->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
  pIVar4->resultId = IVar2;
  pIVar4->typeId = IVar1;
  pIVar4->opCode = OpExtInst;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar4->block = (Block *)0x0;
  type = pIVar4;
  Instruction::reserveOperands(pIVar4,5);
  Instruction::addIdOperand(pIVar4,this_01->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(pIVar4,0x6c);
  pmVar5 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this_01->debugId,&vectorType_local);
  Instruction::addIdOperand(pIVar4,*pmVar5);
  IVar1 = makeUintConstant(this_01,vectorCount,false);
  Instruction::addIdOperand(pIVar4,IVar1);
  IVar1 = makeBoolConstant(this_01,local_38._0_1_,false);
  Instruction::addIdOperand(pIVar4,IVar1);
  local_50._M_head_impl._0_4_ = 0x6c;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_50);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar3,&type);
  local_50._M_head_impl = type;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this_01->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&local_48->module,type);
  pIVar4 = type;
LAB_00359729:
  return pIVar4->resultId;
}

Assistant:

Id Builder::makeMatrixDebugType(Id const vectorType, int const vectorCount, bool columnMajor)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix][t];
        if (type->getIdOperand(0) == vectorType &&
            type->getIdOperand(1) == makeUintConstant(vectorCount))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeMatrix);
    type->addIdOperand(debugId[vectorType]); // vector type id
    type->addIdOperand(makeUintConstant(vectorCount)); // component count id
    type->addIdOperand(makeBoolConstant(columnMajor)); // column-major id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}